

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::gridMesh(Mesh *__return_storage_ptr__,float _width,float _height,int _columns,int _rows
                     ,float _y)

{
  vec<3,_float,_(glm::qualifier)0> vVar1;
  Mesh local_270;
  vec<3,_float,_(glm::qualifier)0> local_1c8;
  vec<3,_float,_(glm::qualifier)0> local_1b4;
  undefined1 local_1a8 [8];
  vec3 down;
  vec<3,_float,_(glm::qualifier)0> local_184;
  undefined1 local_178 [8];
  vec3 top;
  int local_164;
  float pct_1;
  int ix;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_a4;
  undefined1 local_98 [8];
  vec3 right;
  vec<3,_float,_(glm::qualifier)0> local_74;
  undefined1 local_68 [8];
  vec3 left;
  float pct;
  int iy;
  vec3 B;
  vec3 A;
  float halfH;
  float halfW;
  float _y_local;
  int _rows_local;
  int _columns_local;
  float _height_local;
  float _width_local;
  Mesh *mesh;
  
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::setDrawMode(__return_storage_ptr__,LINES);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,_width * 0.5,_y,_height * 0.5);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&pct,-(_width * 0.5),_y,-(_height * 0.5));
  for (left.field_2.z = 0.0; vVar1.field_2 = local_1c8.field_2, vVar1.field_0 = local_1c8.field_0,
      vVar1.field_1 = local_1c8.field_1,
      left.field_2 != (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)_rows;
      left.field_2.z = left.field_2.z + 1) {
    left.field_1.y = (float)left.field_2.z / ((float)_rows + -1.0);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,float,float>
              ((vec<3,float,(glm::qualifier)0> *)&local_74,0.0,_y,left.field_1.y);
    vVar1 = glm::mix<3,float,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,
                       (vec<3,_float,_(glm::qualifier)0> *)&pct,&local_74);
    left.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar1.field_2;
    register0x00001200 = vVar1._0_8_;
    local_68 = (undefined1  [8])register0x00001200;
    glm::vec<3,float,(glm::qualifier)0>::vec<double,float,float>
              ((vec<3,float,(glm::qualifier)0> *)&local_a4,1.0,_y,left.field_1.y);
    vVar1 = glm::mix<3,float,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,
                       (vec<3,_float,_(glm::qualifier)0> *)&pct,&local_a4);
    right.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar1.field_2;
    local_98 = vVar1._0_8_;
    local_b8 = vVar1;
    lineMesh((Mesh *)&pct_1,(vec3 *)local_68,(vec3 *)local_98);
    Mesh::append(__return_storage_ptr__,(Mesh *)&pct_1);
    Mesh::~Mesh((Mesh *)&pct_1);
  }
  local_1c8 = vVar1;
  for (local_164 = 0; local_164 != _columns; local_164 = local_164 + 1) {
    top.field_2.z = (float)local_164 / ((float)_columns + -1.0);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_184,top.field_2.z,_y,0.0);
    vVar1 = glm::mix<3,float,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,
                       (vec<3,_float,_(glm::qualifier)0> *)&pct,&local_184);
    top.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar1.field_2;
    register0x00001200 = vVar1._0_8_;
    local_178 = (undefined1  [8])register0x00001200;
    glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_1b4,top.field_2.z,_y,1.0);
    vVar1 = glm::mix<3,float,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)&B.field_1,
                       (vec<3,_float,_(glm::qualifier)0> *)&pct,&local_1b4);
    down.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar1.field_2;
    local_1a8 = vVar1._0_8_;
    local_1c8 = vVar1;
    lineMesh(&local_270,(vec3 *)local_178,(vec3 *)local_1a8);
    Mesh::append(__return_storage_ptr__,&local_270);
    Mesh::~Mesh(&local_270);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh gridMesh(float _width, float _height, int _columns, int _rows, float _y) {
    Mesh mesh;
    mesh.setDrawMode(LINES);

    // the origin of the plane is at the center //
    float halfW = _width  * 0.5f;
    float halfH = _height * 0.5f;

    //  . --- A
    //  |     |
    //  B --- .

    glm::vec3 A = glm::vec3(halfW, _y, halfH);
    glm::vec3 B = glm::vec3(-halfW, _y, -halfH);

    // add the vertexes //
    for(int iy = 0; iy != _rows; iy++) {
        float pct = ((float)iy/((float)_rows-1));

        glm::vec3 left = glm::mix(A, B, glm::vec3(0.0, _y, pct));
        glm::vec3 right = glm::mix(A, B, glm::vec3(1.0, _y, pct));

        mesh.append( lineMesh(left, right) );
    }

    for(int ix = 0; ix != _columns; ix++) {
        float pct = ((float)ix/((float)_columns-1));

        glm::vec3 top = glm::mix(A, B, glm::vec3(pct, _y, 0.0));
        glm::vec3 down = glm::mix(A, B, glm::vec3(pct, _y, 1.0));

        mesh.append( lineMesh(top, down) );
    }

    return mesh;
}